

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemSetRowSet(Mem *pMem)

{
  sqlite3 *db_00;
  int iVar1;
  char *pcVar2;
  RowSet *pRVar3;
  sqlite3 *db;
  Mem *pMem_local;
  
  db_00 = pMem->db;
  sqlite3VdbeMemRelease(pMem);
  pcVar2 = (char *)sqlite3DbMallocRawNN(db_00,0x40);
  pMem->zMalloc = pcVar2;
  if (db_00->mallocFailed == '\0') {
    iVar1 = sqlite3DbMallocSize(db_00,pMem->zMalloc);
    pMem->szMalloc = iVar1;
    pRVar3 = sqlite3RowSetInit(db_00,pMem->zMalloc,pMem->szMalloc);
    (pMem->u).pRowSet = pRVar3;
    pMem->flags = 0x20;
  }
  else {
    pMem->flags = 1;
    pMem->szMalloc = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetRowSet(Mem *pMem){
  sqlite3 *db = pMem->db;
  assert( db!=0 );
  assert( (pMem->flags & MEM_RowSet)==0 );
  sqlite3VdbeMemRelease(pMem);
  pMem->zMalloc = sqlite3DbMallocRawNN(db, 64);
  if( db->mallocFailed ){
    pMem->flags = MEM_Null;
    pMem->szMalloc = 0;
  }else{
    assert( pMem->zMalloc );
    pMem->szMalloc = sqlite3DbMallocSize(db, pMem->zMalloc);
    pMem->u.pRowSet = sqlite3RowSetInit(db, pMem->zMalloc, pMem->szMalloc);
    assert( pMem->u.pRowSet!=0 );
    pMem->flags = MEM_RowSet;
  }
}